

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  ulong uVar1;
  ulong uVar2;
  TValue *o;
  char *name;
  lua_Debug *plStack_48;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  TValue *local_30;
  lua_Debug *local_28;
  char *local_20;
  TValue *local_18;
  lua_Debug *local_10;
  
  o = (TValue *)0x0;
  name._4_4_ = n;
  plStack_48 = ar;
  ar_local = (lua_Debug *)L;
  if (ar == (lua_Debug *)0x0) {
    if (((int)L->top[-1].field_4.it >> 0xf == -9) &&
       (*(char *)((L->top[-1].u64 & 0x7fffffffffff) + 10) == '\0')) {
      o = (TValue *)
          debug_varname((GCproto *)(*(long *)((L->top[-1].u64 & 0x7fffffffffff) + 0x20) + -0x68),0,
                        n - 1);
    }
  }
  else {
    L_local = (lua_State *)debug_localname(L,ar,(char **)&o,n);
    if (o != (TValue *)0x0) {
      local_30 = *(TValue **)&ar_local->currentline;
      local_28 = ar_local;
      *local_30 = *(TValue *)L_local;
      local_10 = ar_local;
      local_20 = "copy of dead GC object";
      uVar2 = *(long *)&ar_local->currentline + 8;
      *(ulong *)&ar_local->currentline = uVar2;
      uVar1._0_4_ = ar_local->linedefined;
      uVar1._4_4_ = ar_local->lastlinedefined;
      if (uVar1 <= uVar2) {
        local_18 = local_30;
        lj_state_growstack1((lua_State *)ar_local);
      }
    }
  }
  return (char *)o;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  if (ar) {
    TValue *o = debug_localname(L, ar, &name, (BCReg)n);
    if (name) {
      copyTV(L, L->top, o);
      incr_top(L);
    }
  } else if (tvisfunc(L->top-1) && isluafunc(funcV(L->top-1))) {
    name = debug_varname(funcproto(funcV(L->top-1)), 0, (BCReg)n-1);
  }
  return name;
}